

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_encode.c
# Opt level: O0

int yajl_string_validate_utf8(uchar *s,size_t len)

{
  size_t sVar1;
  size_t len_local;
  uchar *s_local;
  int local_4;
  
  if (len == 0) {
    local_4 = 1;
  }
  else {
    len_local = len;
    s_local = s;
    if (s == (uchar *)0x0) {
      local_4 = 0;
    }
    else {
      while (sVar1 = len_local - 1, len_local != 0) {
        if (0x7f < *s_local) {
          if ((int)(uint)*s_local >> 5 == 6) {
            s_local = s_local + 1;
            if (sVar1 == 0) {
              return 0;
            }
            sVar1 = len_local - 2;
            if ((int)(uint)*s_local >> 6 != 2) {
              return 0;
            }
          }
          else if ((int)(uint)*s_local >> 4 == 0xe) {
            if (sVar1 == 0) {
              return 0;
            }
            if ((int)(uint)s_local[1] >> 6 != 2) {
              return 0;
            }
            s_local = s_local + 2;
            if (len_local == 2) {
              return 0;
            }
            sVar1 = len_local - 3;
            if ((int)(uint)*s_local >> 6 != 2) {
              return 0;
            }
          }
          else {
            if ((int)(uint)*s_local >> 3 != 0x1e) {
              return 0;
            }
            if (sVar1 == 0) {
              return 0;
            }
            if ((int)(uint)s_local[1] >> 6 != 2) {
              return 0;
            }
            if (len_local == 2) {
              return 0;
            }
            if ((int)(uint)s_local[2] >> 6 != 2) {
              return 0;
            }
            s_local = s_local + 3;
            if (len_local == 3) {
              return 0;
            }
            sVar1 = len_local - 4;
            if ((int)(uint)*s_local >> 6 != 2) {
              return 0;
            }
          }
        }
        len_local = sVar1;
        s_local = s_local + 1;
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int yajl_string_validate_utf8(const unsigned char * s, size_t len)
{
    if (!len) return 1;
    if (!s) return 0;
    
    while (len--) {
        /* single byte */
        if (*s <= 0x7f) {
            /* noop */
        }
        /* two byte */ 
        else if ((*s >> 5) == 0x6) {
            ADV_PTR;
            if (!((*s >> 6) == 0x2)) return 0;
        }
        /* three byte */
        else if ((*s >> 4) == 0x0e) {
            ADV_PTR;
            if (!((*s >> 6) == 0x2)) return 0;
            ADV_PTR;
            if (!((*s >> 6) == 0x2)) return 0;
        }
        /* four byte */        
        else if ((*s >> 3) == 0x1e) {
            ADV_PTR;
            if (!((*s >> 6) == 0x2)) return 0;
            ADV_PTR;
            if (!((*s >> 6) == 0x2)) return 0;
            ADV_PTR;
            if (!((*s >> 6) == 0x2)) return 0;
        } else {
            return 0;
        }
        
        s++;
    }
    
    return 1;
}